

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paex_write_sine.c
# Opt level: O0

int main(void)

{
  FILE *__stream;
  char *pcVar1;
  PaHostErrorInfo *pPVar2;
  double dVar3;
  PaHostErrorInfo *hostErrorInfo;
  int bufferCount;
  int k;
  int j;
  int i;
  int right_inc;
  int left_inc;
  int right_phase;
  int left_phase;
  float sine [200];
  float buffer [1024] [2];
  uint local_3c;
  PaStream *pPStack_38;
  PaError err;
  PaStream *stream;
  PaStreamParameters outputParameters;
  
  outputParameters.hostApiSpecificStreamInfo._4_4_ = 0;
  left_inc = 0;
  right_inc = 0;
  i = 1;
  j = 3;
  printf("PortAudio Test: output sine wave. SR = %d, BufSize = %d\n",0xac44,0x400);
  for (k = 0; k < 200; k = k + 1) {
    dVar3 = sin(((double)k / 200.0) * 3.141592653589793 * 2.0);
    (&right_phase)[k] = (int)(float)dVar3;
  }
  local_3c = Pa_Initialize();
  if (local_3c == 0) {
    stream._0_4_ = Pa_GetDefaultOutputDevice();
    if ((PaDeviceIndex)stream == -1) {
      fprintf(_stderr,"Error: No default output device.\n");
    }
    else {
      stream._4_4_ = 2;
      outputParameters.device = 1;
      outputParameters.channelCount = 0;
      outputParameters.sampleFormat = 0x3fa999999999999a;
      outputParameters.suggestedLatency = 0.0;
      local_3c = Pa_OpenStream(&stack0xffffffffffffffc8,(PaStreamParameters *)0x0,
                               (PaStreamParameters *)&stream,44100.0,0x400,1,(PaStreamCallback *)0x0
                               ,(void *)0x0);
      if (local_3c == 0) {
        printf("Play 3 times, higher each time.\n");
        for (hostErrorInfo._4_4_ = 0; hostErrorInfo._4_4_ < 3;
            hostErrorInfo._4_4_ = hostErrorInfo._4_4_ + 1) {
          local_3c = Pa_StartStream(pPStack_38);
          if (local_3c != 0) goto LAB_001067dc;
          printf("Play for %d seconds.\n",5);
          for (k = 0; k < 0xd7; k = k + 1) {
            for (bufferCount = 0; bufferCount < 0x400; bufferCount = bufferCount + 1) {
              buffer[(long)bufferCount + -1][0] = (float)(&right_phase)[left_inc];
              buffer[(long)bufferCount + -1][1] = (float)(&right_phase)[right_inc];
              left_inc = i + left_inc;
              if (199 < left_inc) {
                left_inc = left_inc + -200;
              }
              right_inc = j + right_inc;
              if (199 < right_inc) {
                right_inc = right_inc + -200;
              }
            }
            local_3c = Pa_WriteStream(pPStack_38,sine + 0xc6,0x400);
            if (local_3c != 0) goto LAB_001067dc;
          }
          local_3c = Pa_StopStream(pPStack_38);
          if (local_3c != 0) goto LAB_001067dc;
          i = i + 1;
          j = j + 1;
          Pa_Sleep(1000);
        }
        local_3c = Pa_CloseStream(pPStack_38);
        if (local_3c == 0) {
          Pa_Terminate();
          printf("Test finished.\n");
          return 0;
        }
      }
    }
  }
LAB_001067dc:
  fprintf(_stderr,"An error occured while using the portaudio stream\n");
  fprintf(_stderr,"Error number: %d\n",(ulong)local_3c);
  __stream = _stderr;
  pcVar1 = Pa_GetErrorText(local_3c);
  fprintf(__stream,"Error message: %s\n",pcVar1);
  if (local_3c == 0xffffd8f1) {
    pPVar2 = Pa_GetLastHostErrorInfo();
    fprintf(_stderr,"Host API error = #%ld, hostApiType = %d\n",pPVar2->errorCode,
            (ulong)pPVar2->hostApiType);
    fprintf(_stderr,"Host API error = %s\n",pPVar2->errorText);
  }
  Pa_Terminate();
  return local_3c;
}

Assistant:

int main(void)
{
    PaStreamParameters outputParameters;
    PaStream *stream;
    PaError err;
    float buffer[FRAMES_PER_BUFFER][2]; /* stereo output buffer */
    float sine[TABLE_SIZE]; /* sine wavetable */
    int left_phase = 0;
    int right_phase = 0;
    int left_inc = 1;
    int right_inc = 3; /* higher pitch so we can distinguish left and right. */
    int i, j, k;
    int bufferCount;
    
    printf("PortAudio Test: output sine wave. SR = %d, BufSize = %d\n", SAMPLE_RATE, FRAMES_PER_BUFFER);
    
    /* initialise sinusoidal wavetable */
    for( i=0; i<TABLE_SIZE; i++ )
    {
        sine[i] = (float) sin( ((double)i/(double)TABLE_SIZE) * M_PI * 2. );
    }

    
    err = Pa_Initialize();
    if( err != paNoError ) goto error;

    outputParameters.device = Pa_GetDefaultOutputDevice(); /* default output device */
    if (outputParameters.device == paNoDevice) {
      fprintf(stderr,"Error: No default output device.\n");
      goto error;
    }
    outputParameters.channelCount = 2;       /* stereo output */
    outputParameters.sampleFormat = paFloat32; /* 32 bit floating point output */
    outputParameters.suggestedLatency = 0.050; // Pa_GetDeviceInfo( outputParameters.device )->defaultLowOutputLatency;
    outputParameters.hostApiSpecificStreamInfo = NULL;

    err = Pa_OpenStream(
              &stream,
              NULL, /* no input */
              &outputParameters,
              SAMPLE_RATE,
              FRAMES_PER_BUFFER,
              paClipOff,      /* we won't output out of range samples so don't bother clipping them */
              NULL, /* no callback, use blocking API */
              NULL ); /* no callback, so no callback userData */
    if( err != paNoError ) goto error;


    printf( "Play 3 times, higher each time.\n" );
    
    for( k=0; k < 3; ++k )
    {
        err = Pa_StartStream( stream );
        if( err != paNoError ) goto error;

        printf("Play for %d seconds.\n", NUM_SECONDS );

        bufferCount = ((NUM_SECONDS * SAMPLE_RATE) / FRAMES_PER_BUFFER);

        for( i=0; i < bufferCount; i++ )
        {
            for( j=0; j < FRAMES_PER_BUFFER; j++ )
            {
                buffer[j][0] = sine[left_phase];  /* left */
                buffer[j][1] = sine[right_phase];  /* right */
                left_phase += left_inc;
                if( left_phase >= TABLE_SIZE ) left_phase -= TABLE_SIZE;
                right_phase += right_inc;
                if( right_phase >= TABLE_SIZE ) right_phase -= TABLE_SIZE;
            }

            err = Pa_WriteStream( stream, buffer, FRAMES_PER_BUFFER );
            if( err != paNoError ) goto error;
        }   

        err = Pa_StopStream( stream );
        if( err != paNoError ) goto error;

        ++left_inc;
        ++right_inc;

        Pa_Sleep( 1000 );
    }

    err = Pa_CloseStream( stream );
    if( err != paNoError ) goto error;

    Pa_Terminate();
    printf("Test finished.\n");
    
    return err;

error:
    fprintf( stderr, "An error occured while using the portaudio stream\n" );
    fprintf( stderr, "Error number: %d\n", err );
    fprintf( stderr, "Error message: %s\n", Pa_GetErrorText( err ) );
	// Print more information about the error.
	if( err == paUnanticipatedHostError )
	{
		const PaHostErrorInfo *hostErrorInfo = Pa_GetLastHostErrorInfo();
		fprintf( stderr, "Host API error = #%ld, hostApiType = %d\n", hostErrorInfo->errorCode, hostErrorInfo->hostApiType );
		fprintf( stderr, "Host API error = %s\n", hostErrorInfo->errorText );
	}
    Pa_Terminate();
    return err;
}